

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O2

int __thiscall
ExternalCodeEditor::start_editor(ExternalCodeEditor *this,char *editor_cmd,char *filename)

{
  __pid_t _Var1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  int nargs;
  char **args;
  char cmd [1024];
  
  if (G_debug != 0) {
    printf("start_editor() cmd=\'%s\', filename=\'%s\'\n",editor_cmd,filename);
  }
  snprintf(cmd,0x400,"%s %s",editor_cmd,filename);
  _Var1 = fork();
  this->pid_ = _Var1;
  if (_Var1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fl_alert("couldn\'t fork(): %s",pcVar3);
    iVar4 = -1;
  }
  else {
    if (_Var1 == 0) {
      args = (char **)0x0;
      make_args(cmd,&nargs,&args);
      execvp(*args,args);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fl_alert("couldn\'t exec() \'%s\': %s",cmd,pcVar3);
      exit(1);
    }
    iVar4 = L_editors_open + 1;
    bVar5 = L_editors_open == 0;
    L_editors_open = iVar4;
    if (bVar5) {
      start_update_timer();
    }
    if (G_debug == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      printf("--- EDITOR STARTED: pid_=%ld #open=%d\n",(long)this->pid_,(ulong)(uint)L_editors_open)
      ;
    }
  }
  return iVar4;
}

Assistant:

int ExternalCodeEditor::start_editor(const char *editor_cmd,
                                     const char *filename) {
  if ( G_debug ) printf("start_editor() cmd='%s', filename='%s'\n",
                        editor_cmd, filename);
  char cmd[1024];
  snprintf(cmd, sizeof(cmd), "%s %s", editor_cmd, filename);
  // Fork editor to background..
  switch ( pid_ = fork() ) {
    case -1:    // error
      fl_alert("couldn't fork(): %s", strerror(errno));
      return -1;
    case 0: {   // child
      // NOTE: OSX wants minimal code between fork/exec, see Apple TN2083
      int nargs;
      char **args = 0;
      make_args(cmd, &nargs, &args);
      execvp(args[0], args);  // run command - doesn't return if succeeds
      fl_alert("couldn't exec() '%s': %s", cmd, strerror(errno));
      exit(1);
    }
    default:    // parent
      if ( L_editors_open++ == 0 )  // first editor? start timers
        { start_update_timer(); }
      if ( G_debug )
        printf("--- EDITOR STARTED: pid_=%ld #open=%d\n", (long)pid_, L_editors_open);
      break;
  }
  return 0;
}